

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O2

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  memset(wc,0,0xa8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  iVar1 = uv_sem_init(wc,0);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_sem_init(&wc->sem_signaled,0);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_cond_init(&wc->cond);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = uv_mutex_init(&wc->mutex);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          return;
        }
        pcVar2 = "uv_mutex_init(&wc->mutex)";
        uVar3 = 0x3d;
      }
      else {
        pcVar2 = "uv_cond_init(&wc->cond)";
        uVar3 = 0x3c;
      }
    }
    else {
      pcVar2 = "uv_sem_init(&wc->sem_signaled, 0)";
      uVar3 = 0x3b;
    }
  }
  else {
    pcVar2 = "uv_sem_init(&wc->sem_waiting, 0)";
    uVar3 = 0x3a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
          ,uVar3,pcVar2,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT_OK(uv_sem_init(&wc->sem_waiting, 0));
  ASSERT_OK(uv_sem_init(&wc->sem_signaled, 0));
  ASSERT_OK(uv_cond_init(&wc->cond));
  ASSERT_OK(uv_mutex_init(&wc->mutex));
}